

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

void __thiscall bloaty::anon_unknown_0::ElfFile::ElfFile(ElfFile *this,string_view data)

{
  bool bVar1;
  Elf64_Xword in_RDX;
  undefined8 in_RSI;
  Section *in_RDI;
  ElfFile *in_stack_000001c8;
  
  (in_RDI->header_).sh_name = (int)in_RSI;
  (in_RDI->header_).sh_type = (int)((ulong)in_RSI >> 0x20);
  (in_RDI->header_).sh_flags = in_RDX;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)(in_RDI + 1));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[1].header_.sh_flags);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&in_RDI[1].header_.sh_offset);
  Section::Section(in_RDI);
  bVar1 = Initialize(in_stack_000001c8);
  *(bool *)&in_RDI->elf_ = bVar1;
  return;
}

Assistant:

ElfFile(string_view data) : data_(data) {
    ok_ = Initialize();
  }